

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qparallelanimationgroup.cpp
# Opt level: O0

void QParallelAnimationGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QParallelAnimationGroupPrivate *unaff_retaddr;
  QParallelAnimationGroup *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    d_func((QParallelAnimationGroup *)0x67db6f);
    QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished(unaff_retaddr);
  }
  return;
}

Assistant:

void QParallelAnimationGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QParallelAnimationGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_uncontrolledAnimationFinished(); break;
        default: ;
        }
    }
    (void)_a;
}